

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_zero_copy_stream.h
# Opt level: O3

bool __thiscall
google::protobuf::io::internal::TestZeroCopyInputStream::Skip
          (TestZeroCopyInputStream *this,int count)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  Nonnull<const_char_*> failure_msg;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  _Elt_pointer this_00;
  int iVar4;
  bool bVar5;
  bool bVar6;
  LogMessage local_50;
  long local_40 [2];
  
  if (count < 0) {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)count,0,"count >= 0");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream.h"
               ,0x4f,failure_msg);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_50,(char (*) [27])"count must not be negative");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  __ptr = (this->last_returned_buffer_)._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl;
  (this->last_returned_buffer_)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (__ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&this->last_returned_buffer_,__ptr);
  }
  bVar5 = true;
  if (count != 0) {
    do {
      this_00 = (this->buffers_).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      bVar6 = (this->buffers_).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur == this_00;
      bVar5 = !bVar6;
      if (bVar6) {
        return bVar5;
      }
      lVar2 = (long)this_00 -
              (long)(this->buffers_).
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first;
      uVar1 = lVar2 >> 5;
      if ((long)uVar1 < 0) {
        uVar3 = lVar2 >> 9;
LAB_00b23ec9:
        this_00 = (this->buffers_).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar3] + uVar1 + uVar3 * -0x10;
      }
      else if (0xf < uVar1) {
        uVar3 = uVar1 >> 4;
        goto LAB_00b23ec9;
      }
      iVar4 = (int)this_00->_M_string_length;
      if (count < iVar4) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)this_00);
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
        if ((long *)local_50._0_8_ != local_40) {
          operator_delete((void *)local_50._0_8_,local_40[0] + 1);
        }
        this->byte_count_ = this->byte_count_ + (long)count;
        return true;
      }
      this->byte_count_ = this->byte_count_ + (long)iVar4;
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front(&this->buffers_);
      count = count - iVar4;
    } while (count != 0);
  }
  return bVar5;
}

Assistant:

bool Skip(int count) override {
    ABSL_CHECK_GE(count, 0) << "count must not be negative";
    last_returned_buffer_ = nullptr;
    while (true) {
      if (count == 0) return true;
      if (buffers_.empty()) return false;
      auto& front = buffers_[0];
      int front_size = static_cast<int>(front.size());
      if (front_size <= count) {
        count -= front_size;
        byte_count_ += front_size;
        buffers_.pop_front();
      } else {
        // The front is enough, just chomp from it.
        front = front.substr(count);
        byte_count_ += count;
        return true;
      }
    }
  }